

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyMan.c
# Opt level: O2

Ivy_Man_t * Ivy_ManStart(void)

{
  Ivy_Man_t *p;
  Vec_Ptr_t *pVVar1;
  Ivy_Obj_t *pIVar2;
  int *piVar3;
  
  p = (Ivy_Man_t *)calloc(1,0x110);
  (p->Ghost).Id = -1;
  p->fCatchExor = 1;
  p->nTravIds = 1;
  pVVar1 = Vec_PtrAlloc(100);
  p->vPis = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  p->vPos = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  p->vBufs = pVVar1;
  pVVar1 = Vec_PtrAlloc(100);
  p->vObjs = pVVar1;
  Ivy_ManStartMemory(p);
  pIVar2 = p->pListFree;
  if (pIVar2 == (Ivy_Obj_t *)0x0) {
    Ivy_ManAddMemory(p);
    pIVar2 = p->pListFree;
  }
  p->pListFree = *(Ivy_Obj_t **)pIVar2;
  pIVar2->pPrevFan1 = (Ivy_Obj_t *)0x0;
  pIVar2->pEquiv = (Ivy_Obj_t *)0x0;
  pIVar2->pNextFan1 = (Ivy_Obj_t *)0x0;
  pIVar2->pPrevFan0 = (Ivy_Obj_t *)0x0;
  pIVar2->pFanout = (Ivy_Obj_t *)0x0;
  pIVar2->pNextFan0 = (Ivy_Obj_t *)0x0;
  pIVar2->pFanin0 = (Ivy_Obj_t *)0x0;
  pIVar2->pFanin1 = (Ivy_Obj_t *)0x0;
  pIVar2->Id = 0;
  pIVar2->TravId = 0;
  *(undefined8 *)&pIVar2->field_0x8 = 0;
  p->pConst1 = pIVar2;
  pIVar2->field_0x8 = pIVar2->field_0x8 | 0x80;
  Vec_PtrPush(p->vObjs,p->pConst1);
  p->nCreated = 1;
  p->nTableSize = 0x2717;
  piVar3 = (int *)calloc(1,0x9c5c);
  p->pTable = piVar3;
  return p;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Ivy_Man_t * Ivy_ManStart()
{
    Ivy_Man_t * p;
    // start the manager
    p = ABC_ALLOC( Ivy_Man_t, 1 );
    memset( p, 0, sizeof(Ivy_Man_t) );
    // perform initializations
    p->Ghost.Id   = -1;
    p->nTravIds   =  1;
    p->fCatchExor =  1;
    // allocate arrays for nodes
    p->vPis = Vec_PtrAlloc( 100 );
    p->vPos = Vec_PtrAlloc( 100 );
    p->vBufs = Vec_PtrAlloc( 100 );
    p->vObjs = Vec_PtrAlloc( 100 );
    // prepare the internal memory manager
    Ivy_ManStartMemory( p );
    // create the constant node
    p->pConst1 = Ivy_ManFetchMemory( p );
    p->pConst1->fPhase = 1;
    Vec_PtrPush( p->vObjs, p->pConst1 );
    p->nCreated = 1;
    // start the table
    p->nTableSize = 10007;
    p->pTable = ABC_ALLOC( int, p->nTableSize );
    memset( p->pTable, 0, sizeof(int) * p->nTableSize );
    return p;
}